

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_generation_test.cpp
# Opt level: O0

void generateFlatTexture(PatternGeneration *pattern_generation,uint *resolution,uint *i,
                        string *textures_dir,string *scripts_dir)

{
  byte bVar1;
  ostream *poVar2;
  vector<int,_std::allocator<int>_> local_198;
  _InputArray local_180;
  uint local_164;
  Scalar_ local_160 [8];
  Mat flat_texture;
  Scalar flat_color;
  string local_e0 [32];
  string local_c0 [48];
  string local_90 [8];
  string img_filename;
  string local_70 [8];
  string img_name;
  string local_50 [8];
  string material_name;
  string *scripts_dir_local;
  string *textures_dir_local;
  uint *i_local;
  uint *resolution_local;
  PatternGeneration *pattern_generation_local;
  
  std::__cxx11::string::string(local_50);
  std::__cxx11::string::string(local_70);
  std::__cxx11::string::string(local_90);
  genNames("flat_",*i,textures_dir,(string *)local_50,(string *)local_70,(string *)local_90);
  std::__cxx11::string::string(local_c0,local_50);
  std::__cxx11::string::string(local_e0,local_70);
  genScript((string *)local_c0,(string *)local_e0,scripts_dir);
  std::__cxx11::string::~string(local_e0);
  std::__cxx11::string::~string(local_c0);
  PatternGeneration::getRandomColor();
  local_164 = *resolution;
  PatternGeneration::getFlatTexture(local_160,(int *)pattern_generation);
  cv::_InputArray::_InputArray(&local_180,(Mat *)local_160);
  local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_198.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector(&local_198);
  bVar1 = cv::imwrite(local_90,&local_180,(vector *)&local_198);
  std::vector<int,_std::allocator<int>_>::~vector(&local_198);
  cv::_InputArray::~_InputArray(&local_180);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    cv::Mat::~Mat((Mat *)local_160);
    std::__cxx11::string::~string(local_90);
    std::__cxx11::string::~string(local_70);
    std::__cxx11::string::~string(local_50);
    return;
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"[ERROR] Could not save ");
  poVar2 = std::operator<<(poVar2,local_90);
  poVar2 = std::operator<<(poVar2,". Please ensure the destination folder exists!");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  exit(1);
}

Assistant:

void generateFlatTexture(PatternGeneration & pattern_generation,
    unsigned int & resolution,
    const unsigned int & i,
    std::string & textures_dir,
    std::string & scripts_dir)
{    
    std::string material_name, img_name, img_filename;
    genNames("flat_", i, textures_dir, material_name, img_name, img_filename);
    genScript(material_name, img_name, scripts_dir);
    if (!GENERATE_IMG) return;
 
    cv::Scalar flat_color = pattern_generation.getRandomColor();
    cv::Mat flat_texture = pattern_generation.getFlatTexture(flat_color,resolution);

    if (!cv::imwrite(img_filename, flat_texture)){
        std::cout << "[ERROR] Could not save " << img_filename <<
        ". Please ensure the destination folder exists!" << std::endl;
        exit(EXIT_FAILURE);
    }

    if (SHOW_IMGS)
        cv::imshow("Flat texture", flat_texture);
}